

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ImDrawList *pIVar4;
  ImDrawVert *pIVar5;
  unsigned_short *__src;
  ImVec2 IVar6;
  ImDrawVert *pIVar7;
  unsigned_short *__dest;
  ulong uVar8;
  ulong uVar9;
  int rhs_size;
  long lVar10;
  uint uVar11;
  int iVar12;
  ImVector<ImDrawVert> new_vtx_buffer;
  undefined8 local_48;
  ImDrawVert *pIStack_40;
  
  local_48 = 0;
  pIStack_40 = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  if (0 < this->CmdListsCount) {
    lVar10 = 0;
    do {
      pIVar4 = this->CmdLists[lVar10];
      uVar2 = (pIVar4->IdxBuffer).Size;
      if (uVar2 != 0) {
        if (local_48._4_4_ < (int)uVar2) {
          if (local_48._4_4_ == 0) {
            uVar11 = 8;
          }
          else {
            uVar11 = local_48._4_4_ / 2 + local_48._4_4_;
          }
          if ((int)uVar11 <= (int)uVar2) {
            uVar11 = uVar2;
          }
          if (local_48._4_4_ < (int)uVar11) {
            pIVar7 = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar11 * 0x14);
            if (pIStack_40 != (ImDrawVert *)0x0) {
              memcpy(pIVar7,pIStack_40,(long)(int)local_48 * 0x14);
              ImGui::MemFree(pIStack_40);
            }
            local_48 = (ulong)uVar11 << 0x20;
            pIStack_40 = pIVar7;
          }
        }
        iVar12 = local_48._4_4_;
        if (0 < (pIVar4->IdxBuffer).Size) {
          uVar8 = 0;
          if (0 < (int)uVar2) {
            uVar8 = (ulong)uVar2;
          }
          uVar9 = 0;
          pIVar7 = pIStack_40;
          do {
            uVar1 = (pIVar4->IdxBuffer).Data[uVar9];
            if (((pIVar4->VtxBuffer).Size <= (int)(uint)uVar1) || (uVar8 == uVar9)) {
              __assert_fail("i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                            ,0x4e6,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar5 = (pIVar4->VtxBuffer).Data;
            pIVar7->col = pIVar5[uVar1].col;
            pIVar5 = pIVar5 + uVar1;
            IVar6 = pIVar5->uv;
            pIVar7->pos = pIVar5->pos;
            pIVar7->uv = IVar6;
            uVar9 = uVar9 + 1;
            pIVar7 = pIVar7 + 1;
          } while ((long)uVar9 < (long)(pIVar4->IdxBuffer).Size);
        }
        iVar3 = (pIVar4->VtxBuffer).Size;
        (pIVar4->VtxBuffer).Size = uVar2;
        local_48 = CONCAT44((pIVar4->VtxBuffer).Capacity,iVar3);
        (pIVar4->VtxBuffer).Capacity = iVar12;
        pIVar7 = (pIVar4->VtxBuffer).Data;
        (pIVar4->VtxBuffer).Data = pIStack_40;
        iVar12 = (pIVar4->IdxBuffer).Capacity;
        if (iVar12 < 0) {
          iVar12 = iVar12 / 2 + iVar12;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          __dest = (unsigned_short *)ImGui::MemAlloc((ulong)(uint)(iVar12 * 2));
          __src = (pIVar4->IdxBuffer).Data;
          if (__src != (unsigned_short *)0x0) {
            memcpy(__dest,__src,(long)(pIVar4->IdxBuffer).Size * 2);
            ImGui::MemFree((pIVar4->IdxBuffer).Data);
          }
          (pIVar4->IdxBuffer).Data = __dest;
          (pIVar4->IdxBuffer).Capacity = iVar12;
        }
        (pIVar4->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + (pIVar4->VtxBuffer).Size;
        pIStack_40 = pIVar7;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->CmdListsCount);
  }
  if (pIStack_40 != (ImDrawVert *)0x0) {
    ImGui::MemFree(pIStack_40);
  }
  return;
}

Assistant:

static inline bool CanMergeDrawCommands(ImDrawCmd* a, ImDrawCmd* b)
{
    return memcmp(&a->ClipRect, &b->ClipRect, sizeof(a->ClipRect)) == 0 && a->TextureId == b->TextureId && a->VtxOffset == b->VtxOffset && !a->UserCallback && !b->UserCallback;
}